

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O0

void tt_face_done(FT_Face ttface)

{
  FT_Memory memory_00;
  FT_Stream stream_00;
  long lVar1;
  SFNT_Service sfnt;
  FT_Stream stream;
  FT_Memory memory;
  TT_Face face;
  FT_Face ttface_local;
  
  if (ttface != (FT_Face)0x0) {
    memory_00 = ttface->memory;
    stream_00 = ttface->stream;
    lVar1 = *(long *)&ttface[3].units_per_EM;
    if (ttface[4].memory != (FT_Memory)0x0) {
      (*(code *)ttface[4].memory)(ttface[4].driver);
    }
    if (lVar1 != 0) {
      (**(code **)(lVar1 + 0x18))(ttface);
    }
    tt_face_done_loca((TT_Face)ttface);
    tt_face_free_hdmx((TT_Face)ttface);
    ft_mem_free(memory_00,ttface[4].size);
    ttface[4].size = (FT_Size)0x0;
    ttface[4].glyph = (FT_GlyphSlot)0x0;
    FT_Stream_ReleaseFrame(stream_00,(FT_Byte **)&ttface[4].bbox.yMax);
    FT_Stream_ReleaseFrame(stream_00,(FT_Byte **)&ttface[4].max_advance_width);
    ttface[4].bbox.xMax = 0;
    ttface[4].units_per_EM = 0;
    ttface[4].ascender = 0;
    ttface[4].descender = 0;
    ttface[4].height = 0;
    tt_done_blend((TT_Face)ttface);
    ttface[4].autohint.finalizer = (FT_Generic_Finalizer)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_face_done( FT_Face  ttface )           /* TT_Face */
  {
    TT_Face       face = (TT_Face)ttface;
    FT_Memory     memory;
    FT_Stream     stream;
    SFNT_Service  sfnt;


    if ( !face )
      return;

    memory = ttface->memory;
    stream = ttface->stream;
    sfnt   = (SFNT_Service)face->sfnt;

    /* for `extended TrueType formats' (i.e. compressed versions) */
    if ( face->extra.finalizer )
      face->extra.finalizer( face->extra.data );

    if ( sfnt )
      sfnt->done_face( face );

    /* freeing the locations table */
    tt_face_done_loca( face );

    tt_face_free_hdmx( face );

    /* freeing the CVT */
    FT_FREE( face->cvt );
    face->cvt_size = 0;

    /* freeing the programs */
    FT_FRAME_RELEASE( face->font_program );
    FT_FRAME_RELEASE( face->cvt_program );
    face->font_program_size = 0;
    face->cvt_program_size  = 0;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    tt_done_blend( face );
    face->blend = NULL;
#endif
  }